

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hxx
# Opt level: O1

string * trim(string *str)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  pointer pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  pointer pcVar11;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  pcVar11 = pcVar2 + sVar3;
  pcVar7 = pcVar11;
  if (0 < (long)sVar3 >> 2) {
    pcVar7 = pcVar2 + ((uint)sVar3 & 3);
    lVar8 = ((long)sVar3 >> 2) + 1;
    do {
      iVar6 = isspace((int)pcVar11[-1]);
      if (iVar6 == 0) goto LAB_001040cb;
      iVar6 = isspace((int)pcVar11[-2]);
      if (iVar6 == 0) {
        pcVar11 = pcVar11 + -1;
        goto LAB_001040cb;
      }
      iVar6 = isspace((int)pcVar11[-3]);
      if (iVar6 == 0) {
        pcVar11 = pcVar11 + -2;
        goto LAB_001040cb;
      }
      iVar6 = isspace((int)pcVar11[-4]);
      if (iVar6 == 0) {
        pcVar11 = pcVar11 + -3;
        goto LAB_001040cb;
      }
      pcVar11 = pcVar11 + -4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar8 = (long)pcVar7 - (long)pcVar2;
  if (lVar8 == 1) {
LAB_001040a3:
    iVar6 = isspace((int)pcVar7[-1]);
    pcVar11 = pcVar7;
    if (iVar6 != 0) {
      pcVar11 = pcVar2;
    }
  }
  else {
    pcVar11 = pcVar7;
    if (lVar8 == 2) {
LAB_00104092:
      iVar6 = isspace((int)pcVar11[-1]);
      if (iVar6 != 0) {
        pcVar7 = pcVar11 + -1;
        goto LAB_001040a3;
      }
    }
    else {
      pcVar11 = pcVar2;
      if ((lVar8 == 3) && (iVar6 = isspace((int)pcVar7[-1]), pcVar11 = pcVar7, iVar6 != 0)) {
        pcVar11 = pcVar7 + -1;
        goto LAB_00104092;
      }
    }
  }
LAB_001040cb:
  str->_M_string_length = (long)pcVar11 - (long)pcVar2;
  *pcVar11 = '\0';
  pcVar4 = (str->_M_dataplus)._M_p;
  uVar5 = str->_M_string_length;
  pcVar1 = pcVar4 + uVar5;
  pcVar9 = pcVar4;
  if (0 < (long)uVar5 >> 2) {
    pcVar9 = pcVar4 + (uVar5 & 0xfffffffffffffffc);
    lVar8 = ((long)uVar5 >> 2) + 1;
    pcVar10 = pcVar4 + 3;
    do {
      iVar6 = isspace((int)pcVar10[-3]);
      if (iVar6 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_001041b0;
      }
      iVar6 = isspace((int)pcVar10[-2]);
      if (iVar6 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_001041b0;
      }
      iVar6 = isspace((int)pcVar10[-1]);
      if (iVar6 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_001041b0;
      }
      iVar6 = isspace((int)*pcVar10);
      if (iVar6 == 0) goto LAB_001041b0;
      lVar8 = lVar8 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)pcVar1 - (long)pcVar9;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      pcVar10 = pcVar1;
      if ((lVar8 != 3) || (iVar6 = isspace((int)*pcVar9), pcVar10 = pcVar9, iVar6 == 0))
      goto LAB_001041b0;
      pcVar9 = pcVar9 + 1;
    }
    iVar6 = isspace((int)*pcVar9);
    pcVar10 = pcVar9;
    if (iVar6 == 0) goto LAB_001041b0;
    pcVar9 = pcVar9 + 1;
  }
  iVar6 = isspace((int)*pcVar9);
  pcVar10 = pcVar9;
  if (iVar6 != 0) {
    pcVar10 = pcVar1;
  }
LAB_001041b0:
  if (pcVar1 == pcVar10) {
    str->_M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)str,0);
  }
  return str;
}

Assistant:

static inline string & trim(string & str)
{
  return ltrim(rtrim(str));
}